

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeVisitor.hpp
# Opt level: O3

void __thiscall OpenMD::CompositeVisitor::CompositeVisitor(CompositeVisitor *this)

{
  (this->super_BaseVisitor).visitorName._M_dataplus._M_p =
       (pointer)&(this->super_BaseVisitor).visitorName.field_2;
  (this->super_BaseVisitor).visitorName._M_string_length = 0;
  (this->super_BaseVisitor).visitorName.field_2._M_local_buf[0] = '\0';
  (this->super_BaseVisitor)._vptr_BaseVisitor = (_func_int **)&PTR__CompositeVisitor_002bb130;
  (this->visitorList).
  super__List_base<std::pair<OpenMD::BaseVisitor_*,_int>,_std::allocator<std::pair<OpenMD::BaseVisitor_*,_int>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->visitorList;
  (this->visitorList).
  super__List_base<std::pair<OpenMD::BaseVisitor_*,_int>,_std::allocator<std::pair<OpenMD::BaseVisitor_*,_int>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->visitorList;
  (this->visitorList).
  super__List_base<std::pair<OpenMD::BaseVisitor_*,_int>,_std::allocator<std::pair<OpenMD::BaseVisitor_*,_int>_>_>
  ._M_impl._M_node._M_size = 0;
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_BaseVisitor).visitorName,0,(char *)0x0,0x2570ad);
  return;
}

Assistant:

CompositeVisitor() : BaseVisitor() { visitorName = "CompositeVisitor"; }